

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode.cpp
# Opt level: O3

void __thiscall
jess_unicode_case_folding_txt_Test::TestBody(jess_unicode_case_folding_txt_Test *this)

{
  uint *puVar1;
  wchar32 wVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  void *pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  pointer pfVar8;
  char cVar9;
  int iVar10;
  int iVar11;
  size_t sVar12;
  ostream *poVar13;
  iterator __end2;
  ulong uVar14;
  char *pcVar15;
  ulong uVar16;
  pointer pfVar17;
  pointer *__ptr;
  iterator __begin2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar18;
  vector<folding_set,_std::allocator<folding_set>_> folding_sets;
  vector<folding_info,_std::allocator<folding_info>_> folded_codepoints;
  char32_t local_a0;
  undefined4 uStack_9c;
  undefined1 local_98 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  pointer local_88;
  undefined1 local_80 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_78;
  long local_70 [2];
  AssertHelper local_60;
  undefined7 uStack_5f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  AssertHelper local_50 [8];
  vector<folding_info,_std::allocator<folding_info>_> local_48;
  
  read_CaseFolding_txt
            (&local_48,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/data/CaseFolding.txt"
            );
  pfVar8 = local_48.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_98[0] = local_48.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_48.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
                super__Vector_impl_data._M_finish;
  local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
      super__Vector_impl_data._M_start ==
      local_48.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    testing::Message::Message((Message *)&local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)local_80,local_98,"folded_codepoints.empty()","true");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_a0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
               ,0x219,(char *)CONCAT71(local_80._1_7_,local_80[0]));
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_60);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
    if ((long *)CONCAT71(local_80._1_7_,local_80[0]) != local_70) {
      operator_delete((long *)CONCAT71(local_80._1_7_,local_80[0]),local_70[0] + 1);
    }
    if ((long *)CONCAT71(uStack_5f,local_60) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(uStack_5f,local_60) + 8))();
    }
    if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_90,local_90);
    }
  }
  else {
    pfVar17 = local_48.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
              super__Vector_impl_data._M_start;
    do {
      local_98._0_4_ = jessilib::fold(pfVar17->in_codepoint);
      testing::internal::CmpHelperEQ<char32_t,unsigned_int>
                ((internal *)local_80,"jessilib::fold(folded_codepoint.in_codepoint)",
                 "folded_codepoint.out_codepoint",(char32_t *)local_98,&pfVar17->out_codepoint);
      if (local_80[0] == (internal)0x0) {
        testing::Message::Message((Message *)local_98);
        lVar5 = CONCAT44(local_98._4_4_,local_98._0_4_);
        lVar3 = *(long *)(lVar5 + 0x10);
        lVar4 = *(long *)(lVar3 + -0x18);
        *(uint *)(lVar5 + 0x28 + lVar4) = *(uint *)(lVar5 + 0x28 + lVar4) & 0xffffffb5 | 8;
        puVar1 = (uint *)(lVar5 + 0x28 + *(long *)(lVar3 + -0x18));
        *puVar1 = *puVar1 | 0x4000;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar5 + 0x10),"lhs: ",5);
        lVar3 = CONCAT44(local_98._4_4_,local_98._0_4_);
        *(undefined8 *)(lVar3 + 0x20 + *(long *)(*(long *)(lVar3 + 0x10) + -0x18)) = 4;
        std::ostream::_M_insert<unsigned_long>(lVar3 + 0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)(CONCAT44(local_98._4_4_,local_98._0_4_) + 0x10),"; rhs: ",7);
        lVar3 = CONCAT44(local_98._4_4_,local_98._0_4_);
        *(undefined8 *)(lVar3 + 0x20 + *(long *)(*(long *)(lVar3 + 0x10) + -0x18)) = 8;
        std::ostream::_M_insert<unsigned_long>(lVar3 + 0x10);
        pcVar15 = "";
        if (local_78._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar15 = ((local_78._M_head_impl)->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_60,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                   ,0x21d,pcVar15);
        testing::internal::AssertHelper::operator=(&local_60,(Message *)local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_60);
        if ((long *)CONCAT44(local_98._4_4_,local_98._0_4_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98._4_4_,local_98._0_4_) + 8))();
        }
      }
      if (local_78._M_head_impl !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_78,local_78._M_head_impl);
      }
      wVar2 = pfVar17->out_codepoint;
      if (pfVar17->in_codepoint != wVar2) {
        iVar10 = jessilib::fold(pfVar17->in_codepoint);
        iVar11 = jessilib::fold(wVar2);
        local_98[0] = iVar10 == iVar11;
        local_90 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar10 != iVar11) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((AssertionResult *)local_80,(char *)local_98,
                     "jessilib::equalsi(folded_codepoint.in_codepoint, folded_codepoint.out_codepoint)"
                     ,"false");
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&local_a0,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                     ,0x21f,(char *)CONCAT71(local_80._1_7_,local_80[0]));
          testing::internal::AssertHelper::operator=((AssertHelper *)&local_a0,(Message *)&local_60)
          ;
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_a0);
          if ((long *)CONCAT71(local_80._1_7_,local_80[0]) != local_70) {
            operator_delete((long *)CONCAT71(local_80._1_7_,local_80[0]),local_70[0] + 1);
          }
          if ((long *)CONCAT71(uStack_5f,local_60) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT71(uStack_5f,local_60) + 8))();
          }
          if (local_90 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_90,local_90);
          }
        }
      }
      pfVar17 = pfVar17 + 1;
    } while (pfVar17 != pfVar8);
    cVar9 = testing::Test::HasFatalFailure();
    if ((cVar9 != '\0') || (cVar9 = testing::Test::HasNonfatalFailure(), cVar9 != '\0')) {
      folding_sets_from_folding_info
                ((vector<folding_set,_std::allocator<folding_set>_> *)local_98,&local_48);
      pbVar7 = local_90;
      pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(local_98._4_4_,local_98._0_4_);
      local_60 = (AssertHelper)(pbVar18 != local_90);
      local_58 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (pbVar18 == local_90) {
        testing::Message::Message((Message *)&local_a0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((AssertionResult *)local_80,(char *)&local_60,"folding_sets.empty()","true");
        testing::internal::AssertHelper::AssertHelper
                  (local_50,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                   ,0x225,(char *)CONCAT71(local_80._1_7_,local_80[0]));
        testing::internal::AssertHelper::operator=(local_50,(Message *)&local_a0);
        testing::internal::AssertHelper::~AssertHelper(local_50);
        if ((long *)CONCAT71(local_80._1_7_,local_80[0]) != local_70) {
          operator_delete((long *)CONCAT71(local_80._1_7_,local_80[0]),local_70[0] + 1);
        }
        if ((long *)CONCAT44(uStack_9c,local_a0) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(uStack_9c,local_a0) + 8))();
        }
        if (local_58 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_58,local_58);
        }
        pvVar6 = (void *)CONCAT44(local_98._4_4_,local_98._0_4_);
        if (pvVar6 != (void *)0x0) {
          operator_delete(pvVar6,(long)local_88 - (long)pvVar6);
        }
        goto LAB_002015c0;
      }
      do {
        lVar3 = std::cout;
        *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(std::cout + -0x18))
             = *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr +
                        *(long *)(std::cout + -0x18)) & 0xffffffb5 | 8;
        *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(lVar3 + -0x18)) =
             *(uint *)(std::__exception_ptr::exception_ptr::exception_ptr + *(long *)(lVar3 + -0x18)
                      ) | 0x4000;
        lVar3 = *(long *)(lVar3 + -0x18);
        if ((&DAT_0056b5a9)[lVar3] == '\0') {
          std::ios::widen((char)lVar3 + -0x38);
          (&DAT_0056b5a9)[lVar3] = 1;
        }
        jessilib::deserialize_object[lVar3] = (code)0x30;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"{ ",2);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"folding_set::mode_type::",0x18);
        uVar16 = (ulong)*(uint *)&(pbVar18->_M_dataplus)._M_p;
        if (uVar16 < 3) {
          pcVar15 = (&PTR_anon_var_dwarf_397b7b_005533f8)[uVar16];
          sVar12 = strlen(pcVar15);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar15,sVar12);
        }
        else {
          std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x56b4c8);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"0x",2);
        *(undefined8 *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             4;
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,"0x",2);
        *(undefined8 *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x10) = 4;
        poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13,", ",2);
        *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) =
             *(uint *)(poVar13 + *(long *)(*(long *)poVar13 + -0x18) + 0x18) & 0xffffffb5 | 2;
        poVar13 = std::ostream::_M_insert<long>((long)poVar13);
        std::__ostream_insert<char,std::char_traits<char>>(poVar13," },",3);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
        std::ostream::put((char)poVar13);
        std::ostream::flush();
        pbVar18 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((pbVar18->field_2)._M_local_buf + 8);
      } while (pbVar18 != pbVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"folded_codepoints.size(): ",0x1a);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar13,"; folding_sets.size(): ",0x17);
      poVar13 = std::ostream::_M_insert<unsigned_long>((ulong)poVar13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
      std::ostream::put((char)poVar13);
      std::ostream::flush();
      pvVar6 = (void *)CONCAT44(local_98._4_4_,local_98._0_4_);
      if (pvVar6 != (void *)0x0) {
        operator_delete(pvVar6,(long)local_88 - (long)pvVar6);
      }
    }
    local_a0 = L'\0';
    do {
      uVar16 = (long)local_48.super__Vector_base<folding_info,_std::allocator<folding_info>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_48.super__Vector_base<folding_info,_std::allocator<folding_info>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3;
      pfVar8 = local_48.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
               super__Vector_impl_data._M_start;
      while (pfVar17 = pfVar8, 0 < (long)uVar16) {
        uVar14 = uVar16 >> 1;
        uVar16 = ~uVar14 + uVar16;
        pfVar8 = pfVar17 + uVar14 + 1;
        if ((uint)local_a0 <= pfVar17[uVar14].in_codepoint) {
          uVar16 = uVar14;
          pfVar8 = pfVar17;
        }
      }
      if ((pfVar17 ==
           local_48.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
           super__Vector_impl_data._M_finish) || ((uint)local_a0 < pfVar17->in_codepoint)) {
        local_98._0_4_ = jessilib::fold(local_a0);
        testing::internal::CmpHelperEQ<char32_t,char32_t>
                  ((internal *)local_80,"codepoint","jessilib::fold(codepoint)",&local_a0,
                   (char32_t *)local_98);
        if (local_80[0] == (internal)0x0) {
          testing::Message::Message((Message *)local_98);
          pcVar15 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_78._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar15 = *(char **)local_78._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_60,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/test/unicode.cpp"
                     ,0x238,pcVar15);
          testing::internal::AssertHelper::operator=(&local_60,(Message *)local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_60);
          if ((long *)CONCAT44(local_98._4_4_,local_98._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_98._4_4_,local_98._0_4_) + 8))();
          }
        }
        if (local_78._M_head_impl !=
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_78,local_78._M_head_impl);
        }
      }
      local_a0 = local_a0 + L'\x01';
    } while (local_a0 != L'𐀀');
    local_a0 = L'𐀀';
  }
LAB_002015c0:
  if (local_48.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.super__Vector_base<folding_info,_std::allocator<folding_info>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<folding_info,_std::allocator<folding_info>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<folding_info,_std::allocator<folding_info>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(jess, unicode_case_folding_txt) {
	auto folded_codepoints = read_CaseFolding_txt();
	ASSERT_FALSE(folded_codepoints.empty());

	// Test that every folded codepoint is equal to its folded equivalent
	for (auto& folded_codepoint : folded_codepoints) {
		EXPECT_EQ(jessilib::fold(folded_codepoint.in_codepoint), folded_codepoint.out_codepoint)
			<< std::hex << std::uppercase << "lhs: " << std::setw(4) << folded_codepoint.in_codepoint << "; rhs: " << std::setw(8) << folded_codepoint.out_codepoint;
		EXPECT_TRUE(jessilib::equalsi(folded_codepoint.in_codepoint, folded_codepoint.out_codepoint));
	}

	// If the above failed, print out what the fold table needs to be replaced with
	if (::testing::Test::HasFailure()) {
		auto folding_sets = folding_sets_from_folding_info(folded_codepoints);
		ASSERT_FALSE(folding_sets.empty());
		for (auto& set : folding_sets) {
			// Generate code in the format: { folding_set::mode_type::constant, 0x1234, 0x2345, 1 },
			std::cout << std::hex << std::uppercase << std::setfill('0') << "{ "
				<< "folding_set::mode_type::" << set.type()
				<< ", "
				<< "0x" << std::setw(4) << set.range_start << ", "
				<< "0x" << std::setw(4) << set.range_end << ", "
				<< std::dec << set.diff
				<< " }," << std::endl;
		}

		std::cout << "folded_codepoints.size(): " << folded_codepoints.size() << "; folding_sets.size(): " << folding_sets.size() << std::endl;
	}

	// Test that every non-folded codepoint in [0, 0xFFFF] is equal to itself; we already tested folded ones above
	for (char32_t codepoint = 0; codepoint != 0x10000; ++codepoint) {
		bool is_folded = std::binary_search(folded_codepoints.begin(), folded_codepoints.end(), codepoint);
		if (!is_folded) {
			EXPECT_EQ(codepoint, jessilib::fold(codepoint));
			EXPECT_TRUE(jessilib::equalsi(codepoint, codepoint));
		}
	}
}